

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_getinfo(lua_State *L)

{
  char cVar1;
  TValue *pTVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  lua_State *L_00;
  char *what;
  lua_Integer lVar6;
  char *v;
  int idx;
  char *i;
  int arg;
  lj_Debug ar;
  
  L_00 = getthread(L,&arg);
  what = luaL_optlstring(L,arg + 2,"flnSu",(size_t *)0x0);
  idx = arg + 1;
  iVar5 = lua_isnumber(L,idx);
  if (iVar5 == 0) {
    if ((L->top <= L->base + arg) || (L->base[arg].field_4.it >> 0xf != 0x1fff7)) {
      lj_err_arg(L,idx,LJ_ERR_NOFUNCL);
    }
    what = lua_pushfstring(L,">%s",what);
    pTVar2 = L_00->top;
    L_00->top = pTVar2 + 1;
    pTVar2->u64 = L->base[arg].u64 & 0x7fffffffffff | 0xfffb800000000000;
  }
  else {
    lVar6 = lua_tointeger(L,idx);
    iVar5 = lua_getstack(L_00,(int)lVar6,(lua_Debug *)&ar);
    if (iVar5 == 0) {
      L->top[-1].u64 = 0xffffffffffffffff;
      return 1;
    }
  }
  iVar5 = lj_debug_getinfo(L_00,what,&ar,1);
  if (iVar5 == 0) {
    lj_err_arg(L,arg + 2,LJ_ERR_INVOPT);
  }
  bVar4 = false;
  lua_createtable(L,0,0x10);
  bVar3 = false;
  do {
    cVar1 = *what;
    if (cVar1 == 'L') {
      bVar3 = true;
    }
    else if (cVar1 == 'S') {
      settabss(L,"source",ar.source);
      settabss(L,"short_src",ar.short_src);
      settabsi(L,"linedefined",ar.linedefined);
      settabsi(L,"lastlinedefined",ar.lastlinedefined);
      i = "what";
      v = ar.what;
LAB_0012ed9f:
      settabss(L,i,v);
    }
    else if (cVar1 == 'f') {
      bVar4 = true;
    }
    else if (cVar1 == 'l') {
      settabsi(L,"currentline",ar.currentline);
    }
    else {
      if (cVar1 == 'n') {
        settabss(L,"name",ar.name);
        i = "namewhat";
        v = ar.namewhat;
        goto LAB_0012ed9f;
      }
      if (cVar1 == 'u') {
        settabsi(L,"nups",ar.nups);
        settabsi(L,"nparams",ar.nparams);
        lua_pushboolean(L,ar.isvararg);
        lua_setfield(L,-2,"isvararg");
      }
      else if (cVar1 == '\0') {
        if (bVar3) {
          treatstackoption(L,L_00,"activelines");
        }
        if (bVar4) {
          treatstackoption(L,L_00,"func");
        }
        return 1;
      }
    }
    what = what + 1;
  } while( true );
}

Assistant:

LJLIB_CF(debug_getinfo)
{
  lj_Debug ar;
  int arg, opt_f = 0, opt_L = 0;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSu");
  if (lua_isnumber(L, arg+1)) {
    if (!lua_getstack(L1, (int)lua_tointeger(L, arg+1), (lua_Debug *)&ar)) {
      setnilV(L->top-1);
      return 1;
    }
  } else if (L->base+arg < L->top && tvisfunc(L->base+arg)) {
    options = lua_pushfstring(L, ">%s", options);
    setfuncV(L1, L1->top++, funcV(L->base+arg));
  } else {
    lj_err_arg(L, arg+1, LJ_ERR_NOFUNCL);
  }
  if (!lj_debug_getinfo(L1, options, &ar, 1))
    lj_err_arg(L, arg+2, LJ_ERR_INVOPT);
  lua_createtable(L, 0, 16);  /* Create result table. */
  for (; *options; options++) {
    switch (*options) {
    case 'S':
      settabss(L, "source", ar.source);
      settabss(L, "short_src", ar.short_src);
      settabsi(L, "linedefined", ar.linedefined);
      settabsi(L, "lastlinedefined", ar.lastlinedefined);
      settabss(L, "what", ar.what);
      break;
    case 'l':
      settabsi(L, "currentline", ar.currentline);
      break;
    case 'u':
      settabsi(L, "nups", ar.nups);
      settabsi(L, "nparams", ar.nparams);
      settabsb(L, "isvararg", ar.isvararg);
      break;
    case 'n':
      settabss(L, "name", ar.name);
      settabss(L, "namewhat", ar.namewhat);
      break;
    case 'f': opt_f = 1; break;
    case 'L': opt_L = 1; break;
    default: break;
    }
  }
  if (opt_L) treatstackoption(L, L1, "activelines");
  if (opt_f) treatstackoption(L, L1, "func");
  return 1;  /* Return result table. */
}